

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageadapter.h
# Opt level: O0

void __thiscall
bgui::ImageAdapter<float>::adaptMinMaxIntensity
          (ImageAdapter<float> *this,long x,long y,long w,long h)

{
  int iVar1;
  int iVar2;
  long *plVar3;
  double *pdVar4;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  store_t_conflict1 sVar5;
  double v;
  long x_1;
  long y_1;
  int d;
  int dmax;
  int dmin;
  long ymax;
  long ymin;
  long xmax;
  long xmin;
  SVector<long,_2> p2;
  SVector<long,_2> p1;
  SVector<long,_3> *in_stack_fffffffffffffee0;
  SMatrix<long,_2,_3> *in_stack_fffffffffffffee8;
  long i;
  long local_110;
  int local_104;
  int local_100;
  int local_fc;
  long local_f8 [3];
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  SVector<long,_3> local_78;
  SVector<long,_2> local_60;
  SVector<long,_3> local_50;
  SVector<long,_2> local_38;
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  gmath::SVector<long,_3>::SVector
            (&local_50,(long)((double)in_RSI / *(double *)(in_RDI + 0x48)),
             (long)((double)in_RDX / *(double *)(in_RDI + 0x48)),1);
  gmath::SMatrix<long,_2,_3>::operator*(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  gmath::SVector<long,_3>::SVector
            (&local_78,(long)((double)(local_10 + local_20 + -1) / *(double *)(in_RDI + 0x48)),
             (long)((double)(local_18 + local_28 + -1) / *(double *)(in_RDI + 0x48)),1);
  gmath::SMatrix<long,_2,_3>::operator*(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  local_88 = gmath::SVector<long,_2>::operator[](&local_38,0);
  local_90 = gmath::SVector<long,_2>::operator[](&local_60,0);
  plVar3 = std::min<long>(&local_88,&local_90);
  local_80 = *plVar3;
  local_a0 = gmath::SVector<long,_2>::operator[](&local_38,0);
  local_a8 = gmath::SVector<long,_2>::operator[](&local_60,0);
  plVar3 = std::max<long>(&local_a0,&local_a8);
  local_98 = *plVar3;
  local_b8 = gmath::SVector<long,_2>::operator[](&local_38,1);
  local_c0 = gmath::SVector<long,_2>::operator[](&local_60,1);
  plVar3 = std::min<long>(&local_b8,&local_c0);
  local_b0 = *plVar3;
  local_d0 = gmath::SVector<long,_2>::operator[](&local_38,1);
  local_d8 = gmath::SVector<long,_2>::operator[](&local_60,1);
  plVar3 = std::max<long>(&local_d0,&local_d8);
  local_c8 = *plVar3;
  local_e0 = 0;
  plVar3 = std::max<long>(&local_80,&local_e0);
  local_80 = *plVar3;
  local_f8[2] = gimage::Image<float,_gimage::PixelTraits<float>_>::getWidth
                          (*(Image<float,_gimage::PixelTraits<float>_> **)(in_RDI + 0x70));
  local_f8[2] = local_f8[2] + -1;
  plVar3 = std::min<long>(&local_98,local_f8 + 2);
  local_98 = *plVar3;
  local_f8[1] = 0;
  plVar3 = std::max<long>(&local_b0,local_f8 + 1);
  local_b0 = *plVar3;
  local_f8[0] = gimage::Image<float,_gimage::PixelTraits<float>_>::getHeight
                          (*(Image<float,_gimage::PixelTraits<float>_> **)(in_RDI + 0x70));
  local_f8[0] = local_f8[0] + -1;
  plVar3 = std::min<long>(&local_c8,local_f8);
  local_c8 = *plVar3;
  *(undefined8 *)(in_RDI + 0x50) = *(undefined8 *)(in_RDI + 0x88);
  *(undefined8 *)(in_RDI + 0x58) = *(undefined8 *)(in_RDI + 0x80);
  local_fc = 0;
  local_100 = gimage::Image<float,_gimage::PixelTraits<float>_>::getDepth
                        (*(Image<float,_gimage::PixelTraits<float>_> **)(in_RDI + 0x70));
  local_100 = local_100 + -1;
  if ((-1 < *(int *)(in_RDI + 8)) &&
     (iVar1 = *(int *)(in_RDI + 8),
     iVar2 = gimage::Image<float,_gimage::PixelTraits<float>_>::getDepth
                       (*(Image<float,_gimage::PixelTraits<float>_> **)(in_RDI + 0x70)),
     iVar1 < iVar2)) {
    local_100 = *(int *)(in_RDI + 8);
    local_fc = local_100;
  }
  for (local_104 = local_fc; local_104 <= local_100; local_104 = local_104 + 1) {
    for (local_110 = local_b0; i = local_80, local_110 <= local_c8; local_110 = local_110 + 1) {
      for (; i <= local_98; i = i + 1) {
        sVar5 = gimage::Image<float,_gimage::PixelTraits<float>_>::get
                          (*(Image<float,_gimage::PixelTraits<float>_> **)(in_RDI + 0x70),i,
                           local_110,local_104);
        if ((*(double *)(in_RDI + 0x80) <= (double)sVar5) &&
           ((double)sVar5 <= *(double *)(in_RDI + 0x88))) {
          pdVar4 = std::min<double>((double *)(in_RDI + 0x50),(double *)&stack0xfffffffffffffee0);
          *(double *)(in_RDI + 0x50) = *pdVar4;
          pdVar4 = std::max<double>((double *)(in_RDI + 0x58),(double *)&stack0xfffffffffffffee0);
          *(double *)(in_RDI + 0x58) = *pdVar4;
        }
      }
    }
  }
  if (*(double *)(in_RDI + 0x58) <= *(double *)(in_RDI + 0x50)) {
    *(undefined8 *)(in_RDI + 0x50) = 0;
    *(undefined8 *)(in_RDI + 0x58) = 0x3ff0000000000000;
  }
  return;
}

Assistant:

void adaptMinMaxIntensity(long x, long y, long w, long h)
    {
      // compute original area

      const gmath::SVector<long, 2> p1=R*gmath::SVector<long, 3>(static_cast<long>(x/scale),
                                       static_cast<long>(y/scale), 1);
      const gmath::SVector<long, 2> p2=R*gmath::SVector<long, 3>(static_cast<long>((x+w-1)/scale),
                                       static_cast<long>((y+h-1)/scale), 1);

      long xmin=std::min(p1[0], p2[0]), xmax=std::max(p1[0], p2[0]);
      long ymin=std::min(p1[1], p2[1]), ymax=std::max(p1[1], p2[1]);

      xmin=std::max(xmin, 0l);
      xmax=std::min(xmax, image->getWidth()-1);
      ymin=std::max(ymin, 0l);
      ymax=std::min(ymax, image->getHeight()-1);

      // search minimum and maximum valid intensity in the specified area

      imin=vmax;
      imax=vmin;

      int dmin=0;
      int dmax=image->getDepth()-1;

      if (channel >= 0 && channel < image->getDepth())
      {
        dmin=dmax=channel;
      }

      for (int d=dmin; d<=dmax; d++)
      {
        for (long y=ymin; y<=ymax; y++)
        {
          for (long x=xmin; x<=xmax; x++)
          {
            double v=image->get(x, y, d);

            if (v >= vmin && v <= vmax)
            {
              imin=std::min(imin, v);
              imax=std::max(imax, v);
            }
          }
        }
      }

      if (imax <= imin)
      {
        imin=0;
        imax=1;
      }
    }